

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O3

int cfg_validate_int(autobuf *out,char *section_name,char *entry_name,char *value,int64_t min,
                    int64_t max,uint16_t bytelen,uint16_t fraction)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  int64_t i;
  int64_t local_70;
  int64_t local_68;
  isonumber_str hbuf;
  
  uVar5 = (ulong)fraction;
  local_70 = min;
  local_68 = max;
  if (uVar5 == 0) {
    lVar6 = 1;
    iVar1 = isonumber_to_s64(&i,value,1);
    if (iVar1 == 0) goto LAB_00106977;
  }
  else {
    lVar6 = 1;
    uVar2 = uVar5;
    do {
      lVar6 = lVar6 * 10;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    iVar1 = isonumber_to_s64(&i,value,lVar6);
    if (iVar1 == 0) {
LAB_00106977:
      bVar4 = (char)bytelen * -8;
      if ((long)(0x7fffffffffffffffU >> (bVar4 & 0x3f)) < i ||
          i < -0x8000000000000000 >> (bVar4 & 0x3f)) {
        pcVar7 = "large";
        if (i < local_70) {
          pcVar7 = "small";
        }
        cfg_append_printable_line
                  (out,
                   "Value \'%s\' for entry \'%s\' in section %s is too %s for a %d-hyte integer with %d fractional digits"
                   ,value,entry_name,section_name,pcVar7,(ulong)bytelen,uVar5);
      }
      if (i < local_70) {
        uVar3 = isonumber_from_s64(&hbuf,local_70,"",lVar6,1);
        pcVar7 = "Value \'%s\' for entry \'%s\' in section %s is smaller than %s";
      }
      else {
        if (i <= local_68) {
          return 0;
        }
        uVar3 = isonumber_from_s64(&hbuf,local_70,"",lVar6,1);
        pcVar7 = "Value \'%s\' for entry \'%s\' in section %s is larger than %s";
      }
      cfg_append_printable_line(out,pcVar7,value,entry_name,section_name,uVar3);
      return -1;
    }
    if (fraction != 0) {
      cfg_append_printable_line
                (out,
                 "Value \'%s\' for entry \'%s\' in section %s is not a fractional %d-byte integer with a maximum of %d fractional digits"
                 ,value,entry_name,section_name,(ulong)bytelen,uVar5);
      return -1;
    }
  }
  cfg_append_printable_line
            (out,"Value \'%s\' for entry \'%s\' in section %s is not a %d-byte integer.",value,
             entry_name,section_name,(ulong)bytelen);
  return -1;
}

Assistant:

int
cfg_validate_int(struct autobuf *out, const char *section_name, const char *entry_name, const char *value, int64_t min,
  int64_t max, uint16_t bytelen, uint16_t fraction) {
  int64_t i, min64, max64;
  uint64_t j, scaling;
  struct isonumber_str hbuf;

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);
  if (isonumber_to_s64(&i, value, scaling)) {
    if (fraction) {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a fractional %d-byte integer"
        " with a maximum of %d fractional digits",
        value, entry_name, section_name, bytelen, fraction);
    }
    else {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a %d-byte integer.",
        value, entry_name, section_name, bytelen);
    }
    return -1;
  }

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  if (i < min64 || i > max64) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "too %s for a %d-hyte integer with %d fractional digits",
      value, entry_name, section_name, i < min ? "small" : "large", bytelen, fraction);
  }

  if (i < min) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "smaller than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  if (i > max) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "larger than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  return 0;
}